

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

longlong SoapySDRDevice_getHardwareTime(SoapySDRDevice *device,char *what)

{
  undefined1 *puVar1;
  longlong lVar2;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0013df28);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_40,what,&local_41);
  lVar2 = (**(code **)(*(long *)device + 0x270))(device,local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return lVar2;
}

Assistant:

long long SoapySDRDevice_getHardwareTime(const SoapySDRDevice *device, const char *what)
{
    __SOAPY_SDR_C_TRY
    return device->getHardwareTime(what);
    __SOAPY_SDR_C_CATCH
}